

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O2

void rec_call_setup(jit_State *J,BCReg func,ptrdiff_t nargs)

{
  uint *puVar1;
  uint8_t uVar2;
  TRef *pTVar3;
  int iVar4;
  uint uVar5;
  TRef TVar6;
  TRef TVar7;
  IRRef1 IVar8;
  long lVar9;
  ulong uVar10;
  void *ptr;
  GCobj *o;
  bool bVar12;
  RecordIndex ix;
  TValue *pTVar11;
  
  uVar10 = (ulong)func;
  pTVar3 = J->base;
  pTVar11 = J->L->base + uVar10;
  if (pTVar3[uVar10] == 0) {
    sload(J,func);
  }
  puVar1 = pTVar3 + uVar10;
  lVar9 = 0;
  if (0 < nargs) {
    lVar9 = nargs;
  }
  while (bVar12 = lVar9 != 0, lVar9 = lVar9 + -1, bVar12) {
    if (J->base[uVar10 + 1] == 0) {
      sload(J,(int)uVar10 + 1);
    }
    uVar10 = uVar10 + 1;
  }
  uVar5 = *puVar1;
  if ((uVar5 & 0x1f000000) != 0x8000000) {
    ix.tabv.u32 = *(anon_struct_8_2_f9ee98fb_for_u32 *)pTVar11;
    ix.tab = uVar5;
    iVar4 = lj_record_mm_lookup(J,&ix,MM_call);
    if ((iVar4 == 0) || ((ix.mobj & 0x1f000000) != 0x8000000)) {
      lj_trace_err(J,LJ_TRERR_NOMM);
    }
    nargs = nargs + 1;
    for (lVar9 = nargs; 0 < lVar9; lVar9 = lVar9 + -1) {
      puVar1[lVar9] = puVar1[lVar9 + -1];
    }
    *puVar1 = ix.mobj;
    pTVar11 = &ix.mobjv;
    uVar5 = ix.mobj;
  }
  o = (GCobj *)(ulong)(pTVar11->u32).lo;
  uVar2 = (o->gch).unused1;
  IVar8 = (IRRef1)uVar5;
  if ((uVar2 == 'V') || (uVar2 == '$')) {
    (J->fold).ins.field_0.op1 = IVar8;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x44100003;
    TVar6 = lj_opt_fold(J);
    TVar7 = lj_ir_kint(J,(uint)(o->gch).unused1);
    (J->fold).ins.field_0.ot = 0x893;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar6;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar7;
    lj_opt_fold(J);
  }
  else if ((uVar2 == '\0') &&
          (ptr = (void *)(ulong)(o->gch).metatable.gcptr32, 0x5f < *(byte *)((long)ptr + -0x1b))) {
    (J->fold).ins.field_0.op1 = IVar8;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x44050002;
    TVar6 = lj_opt_fold(J);
    TVar7 = lj_ir_kptr_(J,IR_KPTR,ptr);
    (J->fold).ins.field_0.ot = 0x885;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar6;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar7;
    lj_opt_fold(J);
    lj_ir_kgc(J,(GCobj *)((long)ptr + -0x40),IRT_PROTO);
  }
  else {
    uVar5 = lj_ir_kgc(J,o,IRT_FUNC);
    (J->fold).ins.field_0.ot = 0x888;
    (J->fold).ins.field_0.op1 = IVar8;
    (J->fold).ins.field_0.op2 = (IRRef1)uVar5;
    lj_opt_fold(J);
  }
  *puVar1 = uVar5 | 0x10000;
  J->maxslot = (BCReg)nargs;
  return;
}

Assistant:

static void rec_call_setup(jit_State *J, BCReg func, ptrdiff_t nargs)
{
  RecordIndex ix;
  TValue *functv = &J->L->base[func];
  TRef kfunc, *fbase = &J->base[func];
  ptrdiff_t i;
  (void)getslot(J, func); /* Ensure func has a reference. */
  for (i = 1; i <= nargs; i++)
    (void)getslot(J, func+LJ_FR2+i);  /* Ensure all args have a reference. */
  if (!tref_isfunc(fbase[0])) {  /* Resolve __call metamethod. */
    ix.tab = fbase[0];
    copyTV(J->L, &ix.tabv, functv);
    if (!lj_record_mm_lookup(J, &ix, MM_call) || !tref_isfunc(ix.mobj))
      lj_trace_err(J, LJ_TRERR_NOMM);
    for (i = ++nargs; i > LJ_FR2; i--)  /* Shift arguments up. */
      fbase[i+LJ_FR2] = fbase[i+LJ_FR2-1];
#if LJ_FR2
    fbase[2] = fbase[0];
#endif
    fbase[0] = ix.mobj;  /* Replace function. */
    functv = &ix.mobjv;
  }
  kfunc = rec_call_specialize(J, funcV(functv), fbase[0]);
#if LJ_FR2
  fbase[0] = kfunc;
  fbase[1] = TREF_FRAME;
#else
  fbase[0] = kfunc | TREF_FRAME;
#endif
  J->maxslot = (BCReg)nargs;
}